

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STVar.cpp
# Opt level: O1

void __thiscall jbcoin::detail::STVar::STVar(STVar *this,SerialIter *sit,SField *name)

{
  uchar uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  base_uint<128UL,_void> bVar5;
  base_uint<256UL,_void> local_40;
  
  this->p_ = (STBase *)0x0;
  switch(name->fieldType) {
  case STI_NOTPRESENT:
    *(undefined ***)&this->d_ = &PTR__STBase_002d6fc0;
    *(SField **)((long)&this->d_ + 8) = name;
    break;
  case STI_UINT16:
    uVar2 = SerialIter::get16(sit);
    *(SField **)((long)&this->d_ + 8) = name;
    *(undefined ***)&this->d_ = &PTR__STBase_002d95e0;
    *(uint16_t *)((long)&this->d_ + 0x10) = uVar2;
    break;
  case STI_UINT32:
    uVar3 = SerialIter::get32(sit);
    *(SField **)((long)&this->d_ + 8) = name;
    *(undefined ***)&this->d_ = &PTR__STBase_002d9660;
    *(uint32_t *)((long)&this->d_ + 0x10) = uVar3;
    break;
  case STI_UINT64:
    uVar4 = SerialIter::get64(sit);
    *(SField **)((long)&this->d_ + 8) = name;
    *(undefined ***)&this->d_ = &PTR__STBase_002d96c8;
    *(uint64_t *)((long)&this->d_ + 0x10) = uVar4;
    break;
  case STI_HASH128:
    bVar5 = SerialIter::getBitString<128,void>(sit);
    *(SField **)((long)&this->d_ + 8) = name;
    *(undefined ***)&this->d_ = &PTR__STBase_002d84d0;
    *(uint32_t (*) [4])((long)&this->d_ + 0x10) = bVar5.pn;
    break;
  case STI_HASH256:
    SerialIter::getBitString<256,void>(&local_40,sit);
    *(SField **)((long)&this->d_ + 8) = name;
    *(undefined ***)&this->d_ = &PTR__STBase_002d85d0;
    *(undefined8 *)((long)&this->d_ + 0x10) = local_40.pn._0_8_;
    *(undefined8 *)((long)&this->d_ + 0x18) = local_40.pn._8_8_;
    *(ulong *)((long)&this->d_ + 0x20) = CONCAT44(local_40.pn[5],local_40.pn[4]);
    *(undefined8 *)((long)&this->d_ + 0x28) = local_40.pn._24_8_;
    break;
  case STI_AMOUNT:
    STAmount::STAmount((STAmount *)this,sit,name);
    break;
  case STI_VL:
    *(SField **)((long)&this->d_ + 8) = name;
    *(undefined ***)&this->d_ = &PTR__STBlob_002d7028;
    SerialIter::getVLDataLength(sit);
    SerialIter::getRawHelper<jbcoin::Buffer>((SerialIter *)((long)&this->d_ + 0x10),(int)sit);
    break;
  case STI_ACCOUNT:
    STAccount::STAccount((STAccount *)this,sit,name);
    break;
  default:
    Throw<std::runtime_error,char_const(&)[20]>((char (*) [20])"Unknown object type");
  case STI_OBJECT:
    STObject::STObject((STObject *)this,sit,name);
    break;
  case STI_ARRAY:
    STArray::STArray((STArray *)this,sit,name);
    break;
  case STI_UINT8:
    uVar1 = SerialIter::get8(sit);
    *(SField **)((long)&this->d_ + 8) = name;
    *(undefined ***)&this->d_ = &PTR__STBase_002d9560;
    (this->d_).__data[0x10] = uVar1;
    break;
  case STI_HASH160:
    SerialIter::getBitString<160,void>((base_uint<160UL,_void> *)&local_40,sit);
    *(SField **)((long)&this->d_ + 8) = name;
    *(undefined ***)&this->d_ = &PTR__STBase_002d8550;
    *(undefined8 *)((long)&this->d_ + 0x10) = local_40.pn._0_8_;
    *(undefined8 *)((long)&this->d_ + 0x18) = local_40.pn._8_8_;
    *(uint32_t *)((long)&this->d_ + 0x20) = local_40.pn[4];
    break;
  case STI_PATHSET:
    STPathSet::STPathSet((STPathSet *)this,sit,name);
    break;
  case STI_VECTOR256:
    STVector256::STVector256((STVector256 *)this,sit,name);
  }
  this->p_ = (STBase *)this;
  return;
}

Assistant:

STVar::STVar (SerialIter& sit, SField const& name)
{
    switch (name.fieldType)
    {
    case STI_NOTPRESENT:    construct<STBase>(name); return;
    case STI_UINT8:         construct<STUInt8>(sit, name); return;
    case STI_UINT16:        construct<STUInt16>(sit, name); return;
    case STI_UINT32:        construct<STUInt32>(sit, name); return;
    case STI_UINT64:        construct<STUInt64>(sit, name); return;
    case STI_AMOUNT:        construct<STAmount>(sit, name); return;
    case STI_HASH128:       construct<STHash128>(sit, name); return;
    case STI_HASH160:       construct<STHash160>(sit, name); return;
    case STI_HASH256:       construct<STHash256>(sit, name); return;
    case STI_VECTOR256:     construct<STVector256>(sit, name); return;
    case STI_VL:            construct<STBlob>(sit, name); return;
    case STI_ACCOUNT:       construct<STAccount>(sit, name); return;
    case STI_PATHSET:       construct<STPathSet>(sit, name); return;
    case STI_OBJECT:        construct<STObject>(sit, name); return;
    case STI_ARRAY:         construct<STArray>(sit, name); return;
    default:
        Throw<std::runtime_error> ("Unknown object type");
    }
}